

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void __thiscall
boost::detail::variant::destroyer::internal_visit<spartsi::ref_attribute>
          (destroyer *this,ref_attribute *operand,int param_2)

{
  int param_2_local;
  ref_attribute *operand_local;
  destroyer *this_local;
  
  spartsi::ref_attribute::~ref_attribute(operand);
  return;
}

Assistant:

BOOST_VARIANT_AUX_RETURN_VOID_TYPE
    internal_visit(T& operand, int) const BOOST_NOEXCEPT
    {
        operand.~T(); // must be noexcept

#if BOOST_WORKAROUND(__BORLANDC__, BOOST_TESTED_AT(0x0551)) || \
    BOOST_WORKAROUND(BOOST_MSVC, BOOST_TESTED_AT(1600))
        operand; // suppresses warnings
#endif

        BOOST_VARIANT_AUX_RETURN_VOID;
    }